

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O2

int envy_bios_parse_xpiodir(envy_bios *bios)

{
  uint8_t *res;
  uint8_t *res_00;
  uint8_t *res_01;
  uint8_t *res_02;
  ushort uVar1;
  envy_bios_xpio *peVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  envy_bios_xpio *peVar9;
  ulong uVar10;
  long lVar11;
  char *__format;
  byte bVar12;
  ulong uVar13;
  
  uVar1 = (bios->gpio).xpiodir.offset;
  if (uVar1 == 0) {
    return 0;
  }
  res = &(bios->gpio).xpiodir.version;
  iVar4 = bios_u8(bios,(uint)uVar1,res);
  res_00 = &(bios->gpio).xpiodir.hlen;
  iVar5 = bios_u8(bios,(bios->gpio).xpiodir.offset + 1,res_00);
  res_01 = &(bios->gpio).xpiodir.entriesnum;
  iVar6 = bios_u8(bios,(bios->gpio).xpiodir.offset + 2,res_01);
  res_02 = &(bios->gpio).xpiodir.rlen;
  iVar7 = bios_u8(bios,(bios->gpio).xpiodir.offset + 3,res_02);
  envy_bios_block(bios,(uint)(bios->gpio).xpiodir.offset,
                  (uint)(bios->gpio).xpiodir.entriesnum * (uint)(bios->gpio).xpiodir.rlen +
                  (uint)(bios->gpio).xpiodir.hlen,"XPIODIR",-1);
  iVar8 = -0xe;
  if (iVar7 == 0 && (iVar6 == 0 && (iVar5 == 0 && iVar4 == 0))) {
    bVar3 = (bios->gpio).xpiodir.version;
    if (bVar3 != ((bios->gpio).version & 0xf0)) {
      fwrite("XPIODIR version mismatch with GPIO\n",0x23,1,_stderr);
      bVar3 = *res;
    }
    if ((bVar3 == 0x40) || (bVar3 == 0x30)) {
      bVar3 = *res_00;
      uVar13 = (ulong)bVar3;
      if (bVar3 < 4) {
        __format = "XPIODIR table header too short [%d < %d]\n";
        uVar10 = 4;
      }
      else {
        bVar12 = *res_02;
        if (1 < bVar12) {
          if (bVar3 != 4) {
            fprintf(_stderr,"XPIODIR table header longer than expected [%d > %d]\n",uVar13,4);
            bVar12 = *res_02;
          }
          if (2 < bVar12) {
            fprintf(_stderr,"XPIODIR table record longer than expected [%d > %d]\n",(ulong)bVar12,2)
            ;
          }
          bVar3 = (bios->gpio).xpiodir.entriesnum;
          peVar9 = (envy_bios_xpio *)calloc((ulong)bVar3,0x18);
          (bios->gpio).xpiodir.entries = peVar9;
          if (peVar9 == (envy_bios_xpio *)0x0) {
            return -0xc;
          }
          lVar11 = 0;
          uVar13 = 0;
          while( true ) {
            if (bVar3 <= uVar13) {
              (bios->gpio).xpiodir.valid = '\x01';
              return 0;
            }
            peVar2 = (bios->gpio).xpiodir.entries;
            peVar9 = (envy_bios_xpio *)((long)&peVar2->offset + lVar11);
            iVar8 = bios_u16(bios,(uint)(bios->gpio).xpiodir.rlen * (int)uVar13 +
                                  (uint)(bios->gpio).xpiodir.hlen + *(int *)&(bios->gpio).xpiodir &
                                  0xffff,(uint16_t *)peVar9);
            if (iVar8 != 0) break;
            iVar8 = envy_bios_parse_xpio(bios,peVar9,(int)uVar13);
            if (iVar8 != 0) {
              fprintf(_stderr,"Failed to parse XPIO table at 0x%04x version %d.%d\n",
                      (ulong)*(ushort *)((long)&peVar2->offset + lVar11),
                      (ulong)((&peVar2->version)[lVar11] >> 4),
                      (ulong)((&peVar2->version)[lVar11] & 0xf));
            }
            uVar13 = uVar13 + 1;
            bVar3 = *res_01;
            lVar11 = lVar11 + 0x18;
          }
          return -0xe;
        }
        __format = "XPIODIR table record too short [%d < %d]\n";
        uVar10 = 2;
        uVar13 = (ulong)(uint)bVar12;
      }
    }
    else {
      uVar13 = (ulong)(bVar3 >> 4);
      uVar10 = (ulong)(bVar3 & 0xf);
      __format = "Unknown XPIODIR table version %d.%d\n";
    }
    fprintf(_stderr,__format,uVar13,uVar10);
    iVar8 = -0x16;
  }
  return iVar8;
}

Assistant:

int envy_bios_parse_xpiodir (struct envy_bios *bios) {
	struct envy_bios_xpiodir *xpiodir = &bios->gpio.xpiodir;
	int err = 0;
	if (!xpiodir->offset)
		return 0;
	err |= bios_u8(bios, xpiodir->offset, &xpiodir->version);
	err |= bios_u8(bios, xpiodir->offset+1, &xpiodir->hlen);
	err |= bios_u8(bios, xpiodir->offset+2, &xpiodir->entriesnum);
	err |= bios_u8(bios, xpiodir->offset+3, &xpiodir->rlen);
	envy_bios_block(bios, xpiodir->offset, xpiodir->hlen + xpiodir->rlen * xpiodir->entriesnum, "XPIODIR", -1);
	if (err)
		return -EFAULT;
	int wanthlen = 0;
	int wantrlen = 0;
	if (xpiodir->version != (bios->gpio.version & 0xf0))
		ENVY_BIOS_WARN("XPIODIR version mismatch with GPIO\n");
	switch (xpiodir->version) {
		case 0x30:
		case 0x40:
			wanthlen = 4;
			wantrlen = 2;
			break;
		default:
			ENVY_BIOS_ERR("Unknown XPIODIR table version %d.%d\n", xpiodir->version >> 4, xpiodir->version & 0xf);
			return -EINVAL;
	}
	if (xpiodir->hlen < wanthlen) {
		ENVY_BIOS_ERR("XPIODIR table header too short [%d < %d]\n", xpiodir->hlen, wanthlen);
		return -EINVAL;
	}
	if (xpiodir->rlen < wantrlen) {
		ENVY_BIOS_ERR("XPIODIR table record too short [%d < %d]\n", xpiodir->rlen, wantrlen);
		return -EINVAL;
	}
	if (xpiodir->hlen > wanthlen) {
		ENVY_BIOS_WARN("XPIODIR table header longer than expected [%d > %d]\n", xpiodir->hlen, wanthlen);
	}
	if (xpiodir->rlen > wantrlen) {
		ENVY_BIOS_WARN("XPIODIR table record longer than expected [%d > %d]\n", xpiodir->rlen, wantrlen);
	}
	xpiodir->entries = calloc(xpiodir->entriesnum, sizeof *xpiodir->entries);
	if (!xpiodir->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < xpiodir->entriesnum; i++) {
		uint16_t eoff = xpiodir->offset + xpiodir->hlen + xpiodir->rlen * i;
		struct envy_bios_xpio *xpio = &xpiodir->entries[i];
		err |= bios_u16(bios, eoff, &xpio->offset);
		if (err)
			return -EFAULT;
		if (envy_bios_parse_xpio(bios, xpio, i))
			ENVY_BIOS_ERR("Failed to parse XPIO table at 0x%04x version %d.%d\n", xpio->offset, xpio->version >> 4, xpio->version & 0xf);
	}
	xpiodir->valid = 1;
	return 0;
}